

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

int __thiscall libtorrent::aux::piece_picker::num_peers(piece_picker *this,piece_block block)

{
  pointer ppVar1;
  download_queue_t queue;
  uint uVar2;
  iterator dp;
  piece_index_t index;
  span<libtorrent::aux::piece_picker::block_info> sVar3;
  
  ppVar1 = (this->m_piece_map).
           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_start;
  index = block.piece_index.m_val;
  uVar2 = 0;
  if (((ulong)ppVar1[index.m_val] & 0x1c000000) != 0x10000000) {
    queue = piece_pos::download_queue(ppVar1 + index.m_val);
    dp = find_dl_piece(this,queue,index);
    sVar3 = mutable_blocks_for_piece(this,dp._M_current);
    uVar2 = *(ushort *)&sVar3.m_ptr[(long)block >> 0x20].field_0x8 & 0x3fff;
  }
  return uVar2;
}

Assistant:

int piece_picker::num_peers(piece_block const block) const
	{
		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);
		TORRENT_ASSERT(block.piece_index < m_piece_map.end_index());
		TORRENT_ASSERT(block.block_index < blocks_in_piece(block.piece_index));

		piece_pos const& p = m_piece_map[block.piece_index];
		if (!p.downloading()) return 0;

		auto const i = find_dl_piece(p.download_queue(), block.piece_index);
		TORRENT_ASSERT(i != m_downloads[p.download_queue()].end());

		auto const binfo = blocks_for_piece(*i);
		block_info const& info = binfo[block.block_index];
		TORRENT_ASSERT(&info >= &m_block_info[0]);
		TORRENT_ASSERT(&info < &m_block_info[0] + m_block_info.size());
		TORRENT_ASSERT(info.piece_index == block.piece_index);
		return info.num_peers;
	}